

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O3

uint __thiscall doctest::String::size(String *this)

{
  char cVar1;
  uint uVar2;
  char *temp;
  char *pcVar3;
  
  pcVar3 = this->m_str;
  if (pcVar3 != (char *)0x0) {
    uVar2 = 0xffffffff;
    do {
      uVar2 = uVar2 + 1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
    return uVar2;
  }
  return 0;
}

Assistant:

unsigned String::size() const { return m_str ? detail::my_strlen(m_str) : 0; }